

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dlerror.c
# Opt level: O1

int run_test_dlerror(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  uv_loop_t *loop;
  char *unaff_RBX;
  int *piVar4;
  undefined1 auStack_e8 [48];
  undefined1 auStack_b8 [176];
  
  auStack_b8._160_8_ = (__pthread_internal_list *)0x0;
  auStack_b8._168_8_ = (__pthread_internal_list *)0x0;
  auStack_b8._152_8_ = 0x14b87b;
  pcVar2 = uv_dlerror((uv_lib_t *)(auStack_b8 + 0xa0));
  if (pcVar2 == (char *)0x0) {
    auStack_b8._152_8_ = 0x14b93d;
    run_test_dlerror_cold_9();
LAB_0014b93d:
    auStack_b8._152_8_ = 0x14b942;
    run_test_dlerror_cold_8();
LAB_0014b942:
    auStack_b8._152_8_ = 0x14b947;
    run_test_dlerror_cold_1();
LAB_0014b947:
    auStack_b8._152_8_ = 0x14b94c;
    run_test_dlerror_cold_7();
LAB_0014b94c:
    auStack_b8._152_8_ = 0x14b951;
    run_test_dlerror_cold_6();
LAB_0014b951:
    auStack_b8._152_8_ = 0x14b956;
    run_test_dlerror_cold_2();
LAB_0014b956:
    pcVar2 = unaff_RBX;
    auStack_b8._152_8_ = 0x14b95b;
    run_test_dlerror_cold_5();
LAB_0014b95b:
    auStack_b8._152_8_ = 0x14b960;
    run_test_dlerror_cold_4();
  }
  else {
    auStack_b8._152_8_ = 0x14b893;
    pcVar2 = strstr(pcVar2,"no error");
    if (pcVar2 == (char *)0x0) goto LAB_0014b93d;
    auStack_b8._152_8_ = 0x14b8ab;
    iVar1 = uv_dlopen("test/fixtures/load_error.node",(uv_lib_t *)(auStack_b8 + 0xa0));
    if (iVar1 != -1) goto LAB_0014b942;
    auStack_b8._152_8_ = 0x14b8bc;
    pcVar2 = uv_dlerror((uv_lib_t *)(auStack_b8 + 0xa0));
    if (pcVar2 == (char *)0x0) goto LAB_0014b947;
    auStack_b8._152_8_ = 0x14b8d7;
    pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
    unaff_RBX = pcVar2;
    if (pcVar3 == (char *)0x0) goto LAB_0014b94c;
    auStack_b8._152_8_ = 0x14b8eb;
    pcVar2 = strstr(pcVar2,"no error");
    if (pcVar2 != (char *)0x0) goto LAB_0014b951;
    auStack_b8._152_8_ = 0x14b8f8;
    pcVar2 = uv_dlerror((uv_lib_t *)(auStack_b8 + 0xa0));
    if (pcVar2 == (char *)0x0) goto LAB_0014b956;
    auStack_b8._152_8_ = 0x14b90f;
    pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
    if (pcVar3 == (char *)0x0) goto LAB_0014b95b;
    auStack_b8._152_8_ = 0x14b923;
    pcVar3 = strstr(pcVar2,"no error");
    if (pcVar3 == (char *)0x0) {
      auStack_b8._152_8_ = 0x14b930;
      uv_dlclose((uv_lib_t *)(auStack_b8 + 0xa0));
      return 0;
    }
  }
  auStack_b8._152_8_ = 0x14b965;
  run_test_dlerror_cold_3();
  auStack_b8._152_8_ = pcVar2;
  iov = uv_buf_init(buf,0x20);
  pcVar2 = (char *)uv_default_loop();
  ::loop = (uv_loop_t *)pcVar2;
  iVar1 = uv_signal_init((uv_loop_t *)pcVar2,(uv_signal_t *)auStack_b8);
  if (iVar1 == 0) {
    pcVar2 = auStack_b8;
    iVar1 = uv_signal_start((uv_signal_t *)pcVar2,sig_func,10);
    if (iVar1 != 0) goto LAB_0014badd;
    piVar4 = pipe_fds;
    iVar1 = pipe(pipe_fds);
    pcVar2 = (char *)piVar4;
    if (iVar1 != 0) goto LAB_0014bae2;
    pcVar2 = auStack_e8;
    iVar1 = uv_thread_create((uv_thread_t *)pcVar2,thread_main,auStack_e8 + 8);
    if (iVar1 != 0) goto LAB_0014bae7;
    pcVar2 = (char *)::loop;
    iVar1 = uv_fs_read(::loop,&read_req,pipe_fds[0],&iov,1,-1,(uv_fs_cb)0x0);
    if (iVar1 != 0xd) goto LAB_0014baec;
    pcVar2 = buf;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_0014baf1;
    pcVar2 = (char *)::loop;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0014baf6;
    pcVar2 = (char *)(ulong)(uint)pipe_fds[0];
    iVar1 = close(pipe_fds[0]);
    if (iVar1 != 0) goto LAB_0014bafb;
    pcVar2 = (char *)(ulong)(uint)pipe_fds[1];
    iVar1 = close(pipe_fds[1]);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)auStack_b8,(uv_close_cb)0x0);
      loop = uv_default_loop();
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      pcVar2 = (char *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)pcVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014bb05;
    }
  }
  else {
    run_test_eintr_handling_cold_1();
LAB_0014badd:
    run_test_eintr_handling_cold_2();
LAB_0014bae2:
    run_test_eintr_handling_cold_3();
LAB_0014bae7:
    run_test_eintr_handling_cold_4();
LAB_0014baec:
    run_test_eintr_handling_cold_5();
LAB_0014baf1:
    run_test_eintr_handling_cold_6();
LAB_0014baf6:
    run_test_eintr_handling_cold_7();
LAB_0014bafb:
    run_test_eintr_handling_cold_8();
  }
  run_test_eintr_handling_cold_9();
LAB_0014bb05:
  run_test_eintr_handling_cold_10();
  if (((ulong)((uv_loop_t *)pcVar2)->watcher_queue[0] & 3) == 0) {
    uv__signal_stop((uv_signal_t *)pcVar2);
    return 0;
  }
  __assert_fail("!uv__is_closing(handle)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/signal.c"
                ,0x214,"int uv_signal_stop(uv_signal_t *)");
}

Assistant:

TEST_IMPL(dlerror) {
  const char* path = "test/fixtures/load_error.node";
  const char* dlerror_no_error = "no error";
  const char* msg;
  uv_lib_t lib;
  int r;

  lib.errmsg = NULL;
  lib.handle = NULL;
  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
  ASSERT(strstr(msg, dlerror_no_error) != NULL);

  r = uv_dlopen(path, &lib);
  ASSERT(r == -1);

  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
#ifndef __OpenBSD__
  ASSERT(strstr(msg, path) != NULL);
#endif
  ASSERT(strstr(msg, dlerror_no_error) == NULL);

  /* Should return the same error twice in a row. */
  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
#ifndef __OpenBSD__
  ASSERT(strstr(msg, path) != NULL);
#endif
  ASSERT(strstr(msg, dlerror_no_error) == NULL);

  uv_dlclose(&lib);

  return 0;
}